

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void cm_expat_XML_ParserFree(XML_Parser parser)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  void *__src;
  long *plVar5;
  DTD tem;
  undefined1 auStack_158 [312];
  
  do {
    if (*(long *)((long)parser + 0x3d0) == 0) {
      if (*(long *)((long)parser + 0x3d8) == 0) break;
      *(long *)((long)parser + 0x3d0) = *(long *)((long)parser + 0x3d8);
      *(undefined8 *)((long)parser + 0x3d8) = 0;
    }
    puVar2 = *(undefined8 **)((long)parser + 0x3d0);
    *(undefined8 *)((long)parser + 0x3d0) = *puVar2;
    (**(code **)((long)parser + 0x28))(puVar2[6]);
    lVar4 = puVar2[8];
    while (lVar4 != 0) {
      lVar3 = *(long *)(lVar4 + 8);
      (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar4 + 0x20));
      (**(code **)((long)parser + 0x28))(lVar4);
      lVar4 = lVar3;
    }
    (**(code **)((long)parser + 0x28))(puVar2);
  } while( true );
  lVar4 = *(long *)((long)parser + 1000);
  while (lVar4 != 0) {
    lVar3 = *(long *)(lVar4 + 8);
    (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar4 + 0x20));
    (**(code **)((long)parser + 0x28))(lVar4);
    lVar4 = lVar3;
  }
  lVar4 = *(long *)((long)parser + 0x3e0);
  while (lVar4 != 0) {
    lVar3 = *(long *)(lVar4 + 8);
    (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar4 + 0x20));
    (**(code **)((long)parser + 0x28))(lVar4);
    lVar4 = lVar3;
  }
  poolDestroy((STRING_POOL *)((long)parser + 0x418));
  poolDestroy((STRING_POOL *)((long)parser + 0x448));
  if (*(long *)((long)parser + 0x490) != 0) {
    if (*(int *)((long)parser + 0x484) != 0) {
      *(undefined4 *)((long)parser + 0x360) = 0;
    }
    __src = (void *)(*(long *)((long)parser + 0x490) + 0x290);
    memcpy(auStack_158,(void *)((long)parser + 0x290),0x138);
    memcpy((void *)((long)parser + 0x290),__src,0x138);
    memcpy(__src,auStack_158,0x138);
  }
  plVar5 = *(long **)((long)parser + 0x2b8);
  plVar1 = plVar5 + *(long *)((long)parser + 0x2c0);
LAB_0014ce47:
  if (plVar5 != plVar1) goto code_r0x0014ce4c;
  lVar4 = 0;
  goto LAB_0014ce60;
code_r0x0014ce4c:
  lVar4 = *plVar5;
  plVar5 = plVar5 + 1;
  if (lVar4 != 0) {
LAB_0014ce60:
    if (lVar4 == 0) {
      hashTableDestroy((HASH_TABLE *)((long)parser + 0x290));
      hashTableDestroy((HASH_TABLE *)((long)parser + 0x368));
      hashTableDestroy((HASH_TABLE *)((long)parser + 0x2b8));
      hashTableDestroy((HASH_TABLE *)((long)parser + 0x2e0));
      hashTableDestroy((HASH_TABLE *)((long)parser + 0x308));
      poolDestroy((STRING_POOL *)((long)parser + 0x330));
      if (*(long *)((long)parser + 0x3c0) != 0) {
        (**(code **)((long)parser + 0x28))();
      }
      if (*(long *)((long)parser + 0x3a8) != 0) {
        (**(code **)((long)parser + 0x28))();
      }
      (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x400));
      if (*(long *)((long)parser + 0x478) != 0) {
        (**(code **)((long)parser + 0x28))();
      }
      if (*(long *)((long)parser + 0x10) != 0) {
        (**(code **)((long)parser + 0x28))();
      }
      (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x58));
      if (*(long *)((long)parser + 0x1d0) != 0) {
        (**(code **)((long)parser + 0x28))();
      }
      if (*(code **)((long)parser + 0x1e8) != (code *)0x0) {
        (**(code **)((long)parser + 0x1e8))(*(undefined8 *)((long)parser + 0x1d8));
      }
      (**(code **)((long)parser + 0x28))();
      return;
    }
    if (*(int *)(lVar4 + 0x1c) != 0) {
      (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar4 + 0x20));
    }
  }
  goto LAB_0014ce47;
}

Assistant:

void XML_ParserFree(XML_Parser parser)
{
  for (;;) {
    TAG *p;
    if (tagStack == 0) {
      if (freeTagList == 0)
        break;
      tagStack = freeTagList;
      freeTagList = 0;
    }
    p = tagStack;
    tagStack = tagStack->parent;
    FREE(p->buf);
    destroyBindings(p->bindings, parser);
    FREE(p);
  }
  destroyBindings(freeBindingList, parser);
  destroyBindings(inheritedBindings, parser);
  poolDestroy(&tempPool);
  poolDestroy(&temp2Pool);
#ifdef XML_DTD
  if (parentParser) {
    if (hadExternalDoctype)
      dtd.complete = 0;
    dtdSwap(&dtd, &((Parser *)parentParser)->m_dtd);
  }
#endif /* XML_DTD */
  dtdDestroy(&dtd, parser);
  FREE((void *)atts);
  if (groupConnector)
    FREE(groupConnector);
  if (buffer)
    FREE(buffer);
  FREE(dataBuf);
  if (unknownEncodingMem)
    FREE(unknownEncodingMem);
  if (unknownEncodingRelease)
    unknownEncodingRelease(unknownEncodingData);
  FREE(parser);
}